

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutTests.cpp
# Opt level: O0

void __thiscall
vkt::ssbo::anon_unknown_0::Block2LevelUnsizedStructArrayCase::Block2LevelUnsizedStructArrayCase
          (Block2LevelUnsizedStructArrayCase *this,TestContext *testCtx,char *name,char *description
          ,deUint32 layoutFlags,BufferMode bufferMode,int numInstances,
          MatrixLoadFlags matrixLoadFlag)

{
  int size;
  StructType *pSVar1;
  BufferBlock *pBVar2;
  int local_218;
  int local_1cc;
  int lastArrayLen;
  int ndx;
  Random rnd;
  VarType local_1a0;
  VarType local_188;
  BufferVar local_170;
  VarType local_130;
  BufferVar local_118;
  VarType local_d8;
  BufferVar local_c0;
  BufferBlock *local_80;
  BufferBlock *block;
  VarType local_60;
  StructType *local_38;
  StructType *typeS;
  BufferMode bufferMode_local;
  deUint32 layoutFlags_local;
  char *description_local;
  char *name_local;
  TestContext *testCtx_local;
  Block2LevelUnsizedStructArrayCase *this_local;
  
  typeS._0_4_ = bufferMode;
  typeS._4_4_ = layoutFlags;
  _bufferMode_local = description;
  description_local = name;
  name_local = (char *)testCtx;
  testCtx_local = (TestContext *)this;
  SSBOLayoutCase::SSBOLayoutCase
            (&this->super_SSBOLayoutCase,testCtx,name,description,bufferMode,matrixLoadFlag);
  (this->super_SSBOLayoutCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__Block2LevelUnsizedStructArrayCase_016692e0;
  this->m_layoutFlags = typeS._4_4_;
  this->m_numInstances = numInstances;
  pSVar1 = ShaderInterface::allocStruct(&(this->super_SSBOLayoutCase).m_interface,"S");
  local_38 = pSVar1;
  glu::VarType::VarType(&local_60,TYPE_INT_VEC3,PRECISION_HIGHP);
  glu::StructType::addMember(pSVar1,"a",&local_60);
  glu::VarType::~VarType(&local_60);
  pSVar1 = local_38;
  glu::VarType::VarType((VarType *)&block,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  glu::StructType::addMember(pSVar1,"c",(VarType *)&block);
  glu::VarType::~VarType((VarType *)&block);
  pBVar2 = ShaderInterface::allocBlock(&(this->super_SSBOLayoutCase).m_interface,"Block");
  local_80 = pBVar2;
  glu::VarType::VarType(&local_d8,TYPE_UINT,PRECISION_LOWP);
  BufferVar::BufferVar(&local_c0,"u",&local_d8,0);
  BufferBlock::addMember(pBVar2,&local_c0);
  BufferVar::~BufferVar(&local_c0);
  glu::VarType::~VarType(&local_d8);
  pBVar2 = local_80;
  glu::VarType::VarType(&local_130,TYPE_FLOAT_VEC4,PRECISION_MEDIUMP);
  BufferVar::BufferVar(&local_118,"v",&local_130,0x400);
  BufferBlock::addMember(pBVar2,&local_118);
  BufferVar::~BufferVar(&local_118);
  glu::VarType::~VarType(&local_130);
  pBVar2 = local_80;
  glu::VarType::VarType((VarType *)&rnd.m_rnd.z,local_38);
  glu::VarType::VarType(&local_1a0,(VarType *)&rnd.m_rnd.z,2);
  glu::VarType::VarType(&local_188,&local_1a0,-1);
  BufferVar::BufferVar(&local_170,"s",&local_188,0x600);
  BufferBlock::addMember(pBVar2,&local_170);
  BufferVar::~BufferVar(&local_170);
  glu::VarType::~VarType(&local_188);
  glu::VarType::~VarType(&local_1a0);
  glu::VarType::~VarType((VarType *)&rnd.m_rnd.z);
  BufferBlock::setFlags(local_80,this->m_layoutFlags);
  if (0 < this->m_numInstances) {
    BufferBlock::setInstanceName(local_80,"block");
    BufferBlock::setArraySize(local_80,this->m_numInstances);
  }
  de::Random::Random((Random *)&lastArrayLen,0x928);
  local_1cc = 0;
  while( true ) {
    if (this->m_numInstances == 0) {
      local_218 = 1;
    }
    else {
      local_218 = this->m_numInstances;
    }
    if (local_218 <= local_1cc) break;
    size = de::Random::getInt((Random *)&lastArrayLen,1,5);
    BufferBlock::setLastUnsizedArraySize(local_80,local_1cc,size);
    local_1cc = local_1cc + 1;
  }
  de::Random::~Random((Random *)&lastArrayLen);
  (*(this->super_SSBOLayoutCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[2])();
  return;
}

Assistant:

Block2LevelUnsizedStructArrayCase (tcu::TestContext& testCtx, const char* name, const char* description, deUint32 layoutFlags, BufferMode bufferMode, int numInstances, MatrixLoadFlags matrixLoadFlag)
		: SSBOLayoutCase	(testCtx, name, description, bufferMode, matrixLoadFlag)
		, m_layoutFlags		(layoutFlags)
		, m_numInstances	(numInstances)
	{
		StructType& typeS = m_interface.allocStruct("S");
		typeS.addMember("a", VarType(glu::TYPE_INT_VEC3, glu::PRECISION_HIGHP));
		typeS.addMember("c", VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP));

		BufferBlock& block = m_interface.allocBlock("Block");
		block.addMember(BufferVar("u", VarType(glu::TYPE_UINT, glu::PRECISION_LOWP), 0 /* no access */));
		block.addMember(BufferVar("v", VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_MEDIUMP), ACCESS_WRITE));
		block.addMember(BufferVar("s", VarType(VarType(VarType(&typeS), 2), VarType::UNSIZED_ARRAY), ACCESS_READ|ACCESS_WRITE));
		block.setFlags(m_layoutFlags);

		if (m_numInstances > 0)
		{
			block.setInstanceName("block");
			block.setArraySize(m_numInstances);
		}

		{
			de::Random rnd(2344);
			for (int ndx = 0; ndx < (m_numInstances ? m_numInstances : 1); ndx++)
			{
				const int lastArrayLen = rnd.getInt(1, 5);
				block.setLastUnsizedArraySize(ndx, lastArrayLen);
			}
		}

		init();
	}